

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

char * Part_ManFetch(Part_Man_t *p,int nSize)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  Vec_Ptr_t *pVVar8;
  
  if (nSize < 1) {
    __assert_fail("nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                  ,0x78,"char *Part_ManFetch(Part_Man_t *, int)");
  }
  uVar7 = (nSize / p->nStepSize + 1) - (uint)(nSize % p->nStepSize == 0);
  pVVar8 = p->vFree;
  iVar2 = pVVar8->nSize;
  if ((int)uVar7 < iVar2) goto LAB_0060a655;
  iVar6 = uVar7 + 1;
  iVar1 = pVVar8->nCap;
  if ((int)uVar7 < iVar1 * 2) {
    if (iVar1 <= (int)uVar7) {
      if (pVVar8->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((long)iVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar8->pArray,(long)iVar1 << 4);
      }
      pVVar8->pArray = ppvVar3;
      iVar2 = iVar1 * 2;
LAB_0060a628:
      pVVar8->nCap = iVar2;
      iVar2 = pVVar8->nSize;
    }
  }
  else if (iVar1 <= (int)uVar7) {
    if (pVVar8->pArray == (void **)0x0) {
      ppvVar3 = (void **)malloc((long)iVar6 << 3);
    }
    else {
      ppvVar3 = (void **)realloc(pVVar8->pArray,(long)iVar6 << 3);
    }
    pVVar8->pArray = ppvVar3;
    iVar2 = iVar6;
    goto LAB_0060a628;
  }
  if (iVar2 <= (int)uVar7) {
    lVar4 = (long)iVar2;
    do {
      pVVar8->pArray[lVar4] = (void *)0x0;
      lVar4 = lVar4 + 1;
    } while (iVar6 != lVar4);
  }
  pVVar8->nSize = iVar6;
  pVVar8 = p->vFree;
LAB_0060a655:
  if (((int)uVar7 < 0) || (pVVar8->nSize <= (int)uVar7)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pcVar5 = (char *)pVVar8->pArray[uVar7];
  if (pcVar5 == (char *)0x0) {
    lVar4 = (long)(int)uVar7 * (long)p->nStepSize;
    iVar2 = p->nFreeSize;
    iVar6 = (int)lVar4;
    if (iVar2 < iVar6) {
      iVar2 = p->nChunkSize;
      pcVar5 = (char *)malloc((long)iVar2);
      p->pFreeBuf = pcVar5;
      p->nFreeSize = iVar2;
      pVVar8 = p->vMemory;
      uVar7 = pVVar8->nSize;
      if (uVar7 == pVVar8->nCap) {
        if ((int)uVar7 < 0x10) {
          if (pVVar8->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar8->pArray,0x80);
          }
          pVVar8->pArray = ppvVar3;
          pVVar8->nCap = 0x10;
        }
        else {
          if (pVVar8->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar7 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
          }
          pVVar8->pArray = ppvVar3;
          pVVar8->nCap = uVar7 * 2;
        }
      }
      else {
        ppvVar3 = pVVar8->pArray;
      }
      iVar2 = pVVar8->nSize;
      pVVar8->nSize = iVar2 + 1;
      ppvVar3[iVar2] = pcVar5;
      iVar2 = p->nFreeSize;
    }
    if (iVar2 < iVar6) {
      __assert_fail("p->nFreeSize >= nSizeReal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                    ,0x87,"char *Part_ManFetch(Part_Man_t *, int)");
    }
    pcVar5 = p->pFreeBuf;
    p->pFreeBuf = pcVar5 + lVar4;
    p->nFreeSize = iVar2 - iVar6;
  }
  else {
    pVVar8->pArray[uVar7] = *(void **)pcVar5;
  }
  return pcVar5;
}

Assistant:

char * Part_ManFetch( Part_Man_t * p, int nSize )
{
    int Type, nSizeReal;
    char * pMemory;
    assert( nSize > 0 );
    Type = Part_SizeType( nSize, p->nStepSize );
    Vec_PtrFillExtra( p->vFree, Type + 1, NULL );
    if ( (pMemory = (char *)Vec_PtrEntry( p->vFree, Type )) )
    {
        Vec_PtrWriteEntry( p->vFree, Type, Part_OneNext(pMemory) );
        return pMemory;
    }
    nSizeReal = p->nStepSize * Type;
    if ( p->nFreeSize < nSizeReal )
    {
        p->pFreeBuf = ABC_ALLOC( char, p->nChunkSize );
        p->nFreeSize = p->nChunkSize;
        Vec_PtrPush( p->vMemory, p->pFreeBuf );
    }
    assert( p->nFreeSize >= nSizeReal );
    pMemory = p->pFreeBuf;
    p->pFreeBuf  += nSizeReal;
    p->nFreeSize -= nSizeReal;
    return pMemory;
}